

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idruptracer.cpp
# Opt level: O2

void __thiscall CaDiCaL::IdrupTracer::IdrupTracer(IdrupTracer *this,Internal *i,File *f,bool b)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  (this->super_FileTracer).super_InternalTracer.super_Tracer._vptr_Tracer =
       (_func_int **)&PTR__IdrupTracer_00a09798;
  this->internal = i;
  this->file = f;
  this->binary = b;
  this->num_clauses = 0;
  this->size_clauses = 0;
  this->clauses = (IdrupClause **)0x0;
  (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->last_hash = 0;
  this->last_id = 0;
  this->last_clause = (IdrupClause *)0x0;
  this->added = 0;
  this->deleted = 0;
  uVar2 = 0x2a;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    this->nonces[lVar3] = uVar2 | 1;
  }
  bVar1 = File::piping(f);
  this->piping = bVar1;
  return;
}

Assistant:

IdrupTracer::IdrupTracer (Internal *i, File *f, bool b)
    : internal (i), file (f), binary (b), num_clauses (0), size_clauses (0),
      clauses (0), last_hash (0), last_id (0), last_clause (0)
#ifndef QUIET
      ,
      added (0), deleted (0)
#endif
{
  (void) internal;

  // Initialize random number table for hash function.
  //
  Random random (42);
  for (unsigned n = 0; n < num_nonces; n++) {
    uint64_t nonce = random.next ();
    if (!(nonce & 1))
      nonce++;
    assert (nonce), assert (nonce & 1);
    nonces[n] = nonce;
  }
#ifndef NDEBUG
  binary = b;
#else
  (void) b;
#endif
  piping = file->piping ();
}